

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::ProcessKills(GlobOpt *this,Instr *instr)

{
  if (instr->m_opcode == Yield) {
    GlobOptBlockData::KillStateForGeneratorYield(&this->currentBlock->globOptData,instr);
  }
  ProcessFieldKills(this,instr);
  ProcessValueKills(this,instr);
  ProcessArrayValueKills(this,instr);
  return;
}

Assistant:

void
GlobOpt::ProcessKills(IR::Instr *instr)
{
    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->CurrentBlockData()->KillStateForGeneratorYield(instr);
    }
    this->ProcessFieldKills(instr);
    this->ProcessValueKills(instr);
    this->ProcessArrayValueKills(instr);
}